

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O3

DdNode * Llb_ManConstructQuantCubeFwd(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace)

{
  int iVar1;
  int iVar2;
  DdManager *dd;
  abctime aVar3;
  DdNode *pDVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  DdNode *pDVar8;
  
  dd = p->dd;
  aVar3 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar4 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar4);
  pVVar5 = pGroup->vIns;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    pDVar8 = pDVar4;
    do {
      iVar1 = *(int *)((long)pVVar5->pArray[lVar7] + 0x24);
      lVar6 = (long)iVar1;
      if ((lVar6 < 0) || (p->vVarEnds->nSize <= iVar1)) goto LAB_007d4462;
      iVar2 = p->vVarEnds->pArray[lVar6];
      if (iVar2 < iGrpPlace) {
        __assert_fail("iGroupLast >= iGrpPlace",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                      ,0xd8,"DdNode *Llb_ManConstructQuantCubeFwd(Llb_Man_t *, Llb_Grp_t *, int)");
      }
      pDVar4 = pDVar8;
      if (iVar2 <= iGrpPlace) {
        if (p->vObj2Var->nSize <= iVar1) goto LAB_007d4462;
        pDVar4 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[lVar6]);
        pDVar4 = Cudd_bddAnd(p->dd,pDVar8,pDVar4);
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        pVVar5 = pGroup->vIns;
      }
      lVar7 = lVar7 + 1;
      pDVar8 = pDVar4;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = pGroup->vOuts;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    pDVar8 = pDVar4;
    do {
      iVar1 = *(int *)((long)pVVar5->pArray[lVar7] + 0x24);
      lVar6 = (long)iVar1;
      if ((lVar6 < 0) || (p->vVarEnds->nSize <= iVar1)) {
LAB_007d4462:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vVarEnds->pArray[lVar6];
      if (iVar2 < iGrpPlace) {
        __assert_fail("iGroupLast >= iGrpPlace",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Reach.c"
                      ,0xe2,"DdNode *Llb_ManConstructQuantCubeFwd(Llb_Man_t *, Llb_Grp_t *, int)");
      }
      pDVar4 = pDVar8;
      if (iVar2 <= iGrpPlace) {
        if (p->vObj2Var->nSize <= iVar1) goto LAB_007d4462;
        pDVar4 = Cudd_bddIthVar(p->dd,p->vObj2Var->pArray[lVar6]);
        pDVar4 = Cudd_bddAnd(p->dd,pDVar8,pDVar4);
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        pVVar5 = pGroup->vOuts;
      }
      lVar7 = lVar7 + 1;
      pDVar8 = pDVar4;
    } while (lVar7 < pVVar5->nSize);
  }
  Cudd_Deref(pDVar4);
  p->dd->TimeStop = aVar3;
  return pDVar4;
}

Assistant:

DdNode * Llb_ManConstructQuantCubeFwd( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupLast;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        iGroupLast = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupLast >= iGrpPlace );
        if ( iGroupLast > iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        iGroupLast = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupLast >= iGrpPlace );
        if ( iGroupLast > iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}